

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowserPrivate::highlightLink(QTextBrowserPrivate *this,QString *anchor)

{
  bool bVar1;
  int iVar2;
  QString *in_RSI;
  QTextBrowserPrivate *in_RDI;
  long in_FS_OFFSET;
  QUrl url;
  QUrl *in_stack_ffffffffffffffa8;
  QWidget *url_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QTextBrowserPrivate *this_00;
  QUrl local_30;
  QCursor local_28;
  QUrl local_20;
  QCursor local_18;
  QCursor local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QString::isEmpty((QString *)0x6dcfb4);
  if (bVar1) {
    QWidget::cursor((QWidget *)this_00);
    iVar2 = QCursor::shape();
    QCursor::~QCursor(&local_10);
    if (iVar2 != 0xd) {
      QWidget::cursor((QWidget *)this_00);
      QCursor::operator=((QCursor *)in_RSI,(QCursor *)in_RDI);
      QCursor::~QCursor(&local_18);
    }
    QWidget::setCursor((QWidget *)this_00,(QCursor *)in_RSI);
    QUrl::QUrl(&local_20);
    emitHighlighted((QTextBrowserPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8);
    QUrl::~QUrl(&local_20);
  }
  else {
    url_00 = (in_RDI->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport;
    QCursor::QCursor(&local_28,PointingHandCursor);
    QWidget::setCursor((QWidget *)this_00,(QCursor *)in_RSI);
    QCursor::~QCursor(&local_28);
    local_30.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    resolveUrl(this_00,in_RSI);
    emitHighlighted((QTextBrowserPrivate *)
                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(QUrl *)url_00);
    QUrl::~QUrl(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::highlightLink(const QString &anchor)
{
    if (anchor.isEmpty()) {
#ifndef QT_NO_CURSOR
        if (viewport->cursor().shape() != Qt::PointingHandCursor)
            oldCursor = viewport->cursor();
        viewport->setCursor(oldCursor);
#endif
        emitHighlighted(QUrl());
    } else {
#ifndef QT_NO_CURSOR
        viewport->setCursor(Qt::PointingHandCursor);
#endif

        const QUrl url = resolveUrl(anchor);
        emitHighlighted(url);
    }
}